

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  ArrayIndex AVar1;
  uint uVar2;
  ostringstream *this_00;
  string local_1e0;
  Value local_1c0;
  ostringstream oss;
  
  this_00 = (ostringstream *)(ulong)newSize;
  if (this->field_0x8 != '\0') {
    if (this->field_0x8 == '\a') goto LAB_00144d6b;
    this_00 = (ostringstream *)&oss;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"in Json::Value::resize(): requires arrayValue");
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1e0);
  }
  Value(&local_1c0,arrayValue);
  swap(this,&local_1c0);
  ~Value(&local_1c0);
LAB_00144d6b:
  AVar1 = size(this);
  uVar2 = (uint)this_00;
  if (uVar2 == 0) {
    clear(this);
    return;
  }
  if (AVar1 < uVar2) {
    operator[](this,uVar2 - 1);
    return;
  }
  for (; AVar1 != (ArrayIndex)this_00; this_00 = (ostringstream *)(ulong)((ArrayIndex)this_00 + 1))
  {
    _oss = (char *)0x0;
    std::
    _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
    ::erase(&((this->value_).map_)->_M_t,(CZString *)&oss);
    CZString::~CZString((CZString *)&oss);
  }
  return;
}

Assistant:

void Value::resize(ArrayIndex newSize) {
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == arrayValue,
                      "in Json::Value::resize(): requires arrayValue");
  if (type_ == nullValue)
    *this = Value(arrayValue);
  ArrayIndex oldSize = size();
  if (newSize == 0)
    clear();
  else if (newSize > oldSize)
    (*this)[newSize - 1];
  else {
    for (ArrayIndex index = newSize; index < oldSize; ++index) {
      value_.map_->erase(index);
    }
    assert(size() == newSize);
  }
}